

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxbmhandler.cpp
# Opt level: O3

ssize_t __thiscall QXbmHandler::write(QXbmHandler *this,int __fd,void *__buf,size_t __n)

{
  undefined1 uVar1;
  uint uVar2;
  uint uVar3;
  Format FVar4;
  QRgb QVar5;
  QRgb QVar6;
  QIODevice *pQVar7;
  char *__s;
  uchar *puVar8;
  long lVar9;
  size_t sVar10;
  int iVar11;
  undefined8 *puVar12;
  int iVar13;
  ulong uVar14;
  uint i;
  undefined4 in_register_00000034;
  int iVar15;
  char *pcVar16;
  undefined1 *puVar17;
  long lVar18;
  long in_FS_OFFSET;
  undefined1 auVar19 [16];
  QImage local_b0;
  QArrayData *local_98;
  undefined8 *puStack_90;
  undefined1 *local_88;
  undefined1 local_78 [16];
  QImageData *local_68;
  undefined1 local_58 [10];
  char acStack_4e [6];
  QImageData *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar7 = QImageIOHandler::device(&this->super_QImageIOHandler);
  local_68 = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
  local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QImage::QImage((QImage *)local_78,(QImage *)CONCAT44(in_register_00000034,__fd));
  uVar2 = QImage::width((QImage *)local_78);
  uVar3 = QImage::height((QImage *)local_78);
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  local_98 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_90 = (undefined8 *)&DAT_aaaaaaaaaaaaaaaa;
  QString::toUtf8_helper((QString *)&local_98);
  puVar17 = local_88 + 100;
  __s = (char *)operator_new__((ulong)puVar17);
  puVar12 = puStack_90;
  if (puStack_90 == (undefined8 *)0x0) {
    puVar12 = &QByteArray::_empty;
  }
  snprintf(__s,(size_t)puVar17,"#define %s_width %d\n",puVar12,(ulong)uVar2);
  strlen(__s);
  QIODevice::write((char *)pQVar7,(longlong)__s);
  puVar12 = puStack_90;
  if (puStack_90 == (undefined8 *)0x0) {
    puVar12 = &QByteArray::_empty;
  }
  snprintf(__s,(size_t)puVar17,"#define %s_height %d\n",puVar12,(ulong)uVar3);
  strlen(__s);
  QIODevice::write((char *)pQVar7,(longlong)__s);
  snprintf(__s,(size_t)puVar17,"static char %s_bits[] = {\n ");
  strlen(__s);
  QIODevice::write((char *)pQVar7,(longlong)__s);
  FVar4 = QImage::format((QImage *)local_78);
  if (FVar4 != Format_MonoLSB) {
    QImage::convertToFormat_helper
              (&local_b0,(QImage *)local_78,Format_MonoLSB,(ImageConversionFlags)0x0);
    local_48 = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    stack0xffffffffffffffb0 = &DAT_aaaaaaaaaaaaaaaa;
    QPaintDevice::QPaintDevice((QPaintDevice *)local_58);
    local_48 = local_68;
    local_68 = local_b0.d;
    local_58._0_8_ = &PTR__QImage_007d1ec8;
    local_b0.d = (QImageData *)0x0;
    QImage::~QImage((QImage *)local_58);
    QImage::~QImage(&local_b0);
  }
  lVar18 = 0;
  QVar5 = QImage::color((QImage *)local_78,0);
  QVar6 = QImage::color((QImage *)local_78,1);
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  stack0xffffffffffffffb0 = &DAT_aaaaaaaaaaaaaaaa;
  auVar19 = _DAT_00674840;
  do {
    if (SUB164(auVar19 ^ _DAT_00674850,4) == -0x80000000 &&
        SUB164(auVar19 ^ _DAT_00674850,0) < -0x7ffffff6) {
      local_58[lVar18] = (byte)lVar18 + 0x30;
      local_58[lVar18 + 1] = (byte)lVar18 | 0x31;
    }
    lVar18 = lVar18 + 2;
    lVar9 = auVar19._8_8_;
    auVar19._0_8_ = auVar19._0_8_ + 2;
    auVar19._8_8_ = lVar9 + 2;
  } while (lVar18 != 10);
  uVar14 = 0;
  do {
    if (uVar14 < 6) {
      acStack_4e[uVar14] = (char)uVar14 + 'a';
      acStack_4e[uVar14 + 1] = (char)uVar14 + 'b';
    }
    uVar14 = uVar14 + 2;
  } while (uVar14 != 6);
  if ((QVar5 & 0xff) * 5 + (QVar5 >> 4 & 0xff0) + (QVar5 >> 0x10 & 0xff) * 0xb >> 5 <
      (QVar6 & 0xff) * 5 + (QVar6 >> 4 & 0xff0) + (QVar6 >> 0x10 & 0xff) * 0xb >> 5) {
    lVar18 = 0xf;
    puVar17 = local_58;
    do {
      uVar1 = local_58[lVar18];
      local_58[lVar18] = *puVar17;
      *puVar17 = uVar1;
      lVar18 = lVar18 + -1;
      puVar17 = puVar17 + 1;
    } while (lVar18 != 7);
  }
  pcVar16 = __s;
  if (0 < (int)uVar3) {
    iVar11 = uVar2 + 0xe;
    if (-1 < (int)(uVar2 + 7)) {
      iVar11 = uVar2 + 7;
    }
    iVar11 = iVar11 >> 3;
    iVar15 = 1;
    if (1 < iVar11) {
      iVar15 = iVar11;
    }
    i = 0;
    iVar13 = 0;
    do {
      puVar8 = QImage::constScanLine((QImage *)local_78,i);
      if (0 < (int)uVar2) {
        lVar18 = 0;
        do {
          pcVar16[0] = '0';
          pcVar16[1] = 'x';
          pcVar16[2] = local_58[puVar8[lVar18] >> 4];
          pcVar16[3] = local_58[puVar8[lVar18] & 0xf];
          if ((int)lVar18 < iVar11 + -1 || (int)i < (int)(uVar3 - 1)) {
            pcVar16[4] = ',';
            if (iVar13 < 0xe) {
              iVar13 = iVar13 + 1;
              pcVar16 = pcVar16 + 5;
            }
            else {
              pcVar16[5] = '\n';
              pcVar16[6] = ' ';
              pcVar16[7] = '\0';
              sVar10 = strlen(__s);
              lVar9 = QIODevice::write((char *)pQVar7,(longlong)__s);
              iVar13 = 0;
              pcVar16 = __s;
              if ((int)sVar10 != lVar9) {
                uVar14 = 0;
                goto LAB_002b8586;
              }
            }
          }
          else {
            pcVar16 = pcVar16 + 4;
          }
          lVar18 = lVar18 + 1;
        } while (iVar15 != (int)lVar18);
      }
      i = i + 1;
    } while (i != uVar3);
  }
  builtin_strncpy(pcVar16," };\n",5);
  sVar10 = strlen(__s);
  lVar18 = QIODevice::write((char *)pQVar7,(longlong)__s);
  uVar14 = CONCAT71((int7)(int3)(sVar10 >> 8),(int)sVar10 == lVar18);
LAB_002b8586:
  operator_delete__(__s);
  if (local_98 != (QArrayData *)0x0) {
    LOCK();
    (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_98,1,0x10);
    }
  }
  QImage::~QImage((QImage *)local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return uVar14 & 0xffffffff;
}

Assistant:

bool QXbmHandler::write(const QImage &image)
{
    return write_xbm_image(image, device(), fileName);
}